

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O1

int domonnoise(monst *mtmp)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  obj *poVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  trap *ptVar11;
  char *pcVar12;
  char cVar13;
  int iVar14;
  permonst *ppVar15;
  char **ppcVar16;
  long amount;
  bool bVar17;
  bool bVar18;
  char verbuf [256];
  char local_138 [8];
  char acStack_130 [8];
  char acStack_128 [8];
  undefined2 uStack_120;
  undefined6 local_11e;
  undefined2 uStack_118;
  char acStack_116 [230];
  
  if (flags.soundok == '\0') {
    return 0;
  }
  ppVar15 = mtmp->data;
  if (ppVar15->msound == '\0') {
    return 0;
  }
  if (ppVar15 != &pm_guardian && ppVar15->msound == '!') {
    iVar3 = monsndx(ppVar15);
    iVar3 = genus(iVar3,1);
    ppVar15 = mons + iVar3;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))
    goto LAB_00245a08;
LAB_002459b3:
    uVar5 = *(uint *)&mtmp->field_0x60;
    if (((uVar5 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_002459fb;
      goto LAB_00245a08;
    }
    if ((uVar5 & 0x280) != 0) goto LAB_00245a08;
LAB_002459fb:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_00245a08;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') goto LAB_002459b3;
LAB_00245a08:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
        (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_00245b40;
        iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if ((iVar3 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_00245b79;
        goto LAB_00245b50;
      }
    }
    else {
LAB_00245b40:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_00245b50:
        if ((u.uprops[0x42].extrinsic == 0) && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')) {
          map_invisible(mtmp->mx,mtmp->my);
        }
      }
    }
  }
LAB_00245b79:
  pcVar10 = (char *)0x0;
  pcVar9 = (char *)0x0;
  switch(ppVar15->msound) {
  case '\x01':
    if ((flags.moonphase == 4) && (iVar3 = night(), iVar3 != 0)) {
      pcVar9 = "howls.";
    }
    else if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      pcVar9 = "growls.";
    }
    else {
      if (mtmp->mtame == '\0') {
LAB_00246654:
        pcVar10 = (char *)0x0;
        pcVar9 = "barks.";
        if (mtmp->data == mons + 0x15) {
          pcVar9 = (char *)0x0;
        }
        goto switchD_00245b9e_caseD_e;
      }
      pcVar9 = "whines.";
      if ((*(uint *)&mtmp->field_0x60 & 0xa10000) == 0) {
        pcVar10 = (char *)0x0;
        if ((mtmp->mtame < '\x05') || (*(uint *)((long)&mtmp[1].data + 4) < moves))
        goto switchD_00245b9e_caseD_e;
        if (*(uint *)((long)&mtmp[1].data + 4) <= moves + 1000) goto LAB_00246654;
        pcVar9 = "yips.";
      }
    }
    break;
  case '\x02':
    if (mtmp->mtame == '\0') goto switchD_00245b9e_caseD_4;
    pcVar10 = (char *)0x0;
    pcVar9 = "yowls.";
    if ((mtmp->mtame < '\x05') || ((*(uint *)&mtmp->field_0x60 & 0xa10000) != 0))
    goto switchD_00245b9e_caseD_e;
    uVar5 = *(uint *)((long)&mtmp[1].data + 4);
    if (moves <= uVar5) {
      bVar18 = uVar5 < moves + 1000;
      bVar17 = uVar5 == moves + 1000;
      pcVar10 = "purrs.";
      pcVar9 = "mews.";
      goto LAB_00246743;
    }
    pcVar9 = "meows.";
    break;
  case '\x03':
    bVar1 = mtmp->field_0x62;
    pcVar10 = "roars!";
LAB_00246283:
    pcVar9 = "snarls.";
    goto LAB_0024628a;
  case '\x04':
switchD_00245b9e_caseD_4:
    if ((mtmp->mtame == '\0') ||
       (ppVar15 = mtmp->data,
       ppVar15 != mons + 0xf3 && (ppVar15 != mons + 0xf0 && ppVar15 != mons + 0xef))) {
      bVar1 = mtmp->field_0x62;
      pcVar10 = "growls!";
      goto LAB_00246283;
    }
    if (((mtmp->field_0x62 & 0xa1) == 0) &&
       (uVar5 = *(uint *)((long)&mtmp[1].data + 4), '\x04' < mtmp->mtame && moves <= uVar5)) {
      bVar18 = uVar5 < moves + 1000;
      bVar17 = uVar5 == moves + 1000;
      pcVar10 = "chatters.";
      pcVar9 = "hoots.";
      goto LAB_00246743;
    }
    wake_nearto((int)mtmp->mx,(int)mtmp->my,0x40);
    goto LAB_00245f28;
  case '\x05':
    pcVar9 = "squeaks.";
    break;
  case '\x06':
    if ((ppVar15 == mons + 0x84) && ((mtmp->field_0x62 & 0x40) == 0)) {
      pcVar10 = "Nevermore!";
      goto switchD_00245b9e_default;
    }
    pcVar9 = "squawks.";
    break;
  case '\a':
    if ((mtmp->field_0x62 & 0x40) != 0) {
      return 0;
    }
    pcVar9 = "hisses!";
    break;
  case '\b':
    bVar1 = mtmp->field_0x62;
    pcVar10 = "buzzes angrily.";
    pcVar9 = "drones.";
LAB_0024628a:
    if ((bVar1 & 0x40) == 0) {
      pcVar9 = pcVar10;
    }
    break;
  case '\t':
    pcVar9 = "grunts.";
    break;
  case '\n':
    if (mtmp->mtame < '\x05') {
      pcVar9 = "neighs.";
    }
    else {
      uVar5 = *(uint *)((long)&mtmp[1].data + 4);
      bVar18 = moves < uVar5;
      bVar17 = moves == uVar5;
      pcVar10 = "whinnies.";
      pcVar9 = "whickers.";
LAB_00246743:
      if (!bVar18 && !bVar17) {
        pcVar9 = pcVar10;
      }
    }
    break;
  case '\v':
    pcVar9 = "wails mournfully.";
    break;
  case '\f':
    pcVar9 = "gurgles.";
    break;
  case '\r':
    pcVar9 = "burbles.";
    break;
  case '\x0e':
    goto switchD_00245b9e_caseD_e;
  case '\x0f':
    aggravate();
LAB_00245f28:
    pcVar9 = "shrieks.";
    break;
  case '\x10':
    pcVar10 = Monnam(mtmp);
    pline("%s rattles noisily.",pcVar10);
    pline("You freeze for a moment.");
    nomul(-2,"scared by rattling");
    pcVar10 = (char *)0x0;
  default:
switchD_00245b9e_default:
    pcVar9 = (char *)0x0;
    goto switchD_00245b9e_caseD_e;
  case '\x11':
    uVar5 = mt_random();
    pcVar9 = domonnoise_laugh_msg_rel + *(int *)(domonnoise_laugh_msg_rel + (ulong)(uVar5 & 3) * 4);
    break;
  case '\x12':
    pcVar9 = "mumbles incomprehensibly.";
    break;
  case '\x13':
    pcVar9 = "imitates you.";
    break;
  case '\x14':
switchD_00245b9e_caseD_14:
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((uVar5 >> 0x16 & 1) == 0) {
      if ((mons + 0x168 < ppVar15 || ppVar15 < mons + 0x159) ||
          u.uz.dnum != dungeon_topology.d_astral_level.dnum) {
        return 0;
      }
      mplayer_talk(mtmp);
      goto LAB_0024640c;
    }
    if ((uVar5 >> 0x10 & 1) == 0) {
      iVar3 = mtmp->mhpmax;
      iVar14 = iVar3 + 3;
      if (-1 < iVar3) {
        iVar14 = iVar3;
      }
      if (iVar14 >> 2 <= mtmp->mhp) {
        if ((uVar5 & 0x300000) == 0) {
          if ((uVar5 >> 0x11 & 1) == 0) {
            pcVar10 = "I can\'t see!";
          }
          else {
            if ((uVar5 >> 0x17 & 1) == 0) {
              if (mtmp->mhp < iVar3 / 2) {
                pcVar9 = "asks for a potion of healing.";
              }
              else {
                if ((((uVar5 >> 0x1a & 1) == 0) && (mtmp->mtame != '\0')) &&
                   (*(uint *)((long)&mtmp[1].data + 4) < moves)) {
                  pcVar10 = "I\'m hungry.";
                  goto switchD_00245b9e_default;
                }
                uVar5 = ppVar15->mflags2;
                if ((uVar5 & 0x10) == 0) {
                  if ((uVar5 & 0x20) == 0) {
                    if ((int)uVar5 < 0) {
                      pcVar9 = "talks about spellcraft.";
                    }
                    else if (ppVar15->mlet == '\x1d') {
                      pcVar9 = "discusses hunting.";
                    }
                    else {
                      iVar3 = monsndx(ppVar15);
                      if (iVar3 == 0x166) {
                        pcVar10 = "Aloha.";
                        goto switchD_00245b9e_default;
                      }
                      if (iVar3 == 0x159) {
                        pcVar9 = "describes a recent article in \"Spelunker Today\" magazine.";
                      }
                      else if (iVar3 == 0x2c) {
                        pcVar9 = "asks you about the One Ring.";
                        if (9 < mtmp->mhpmax - mtmp->mhp) {
                          pcVar9 = "complains about unpleasant dungeon conditions.";
                        }
                      }
                      else {
                        pcVar9 = "discusses dungeon exploration.";
                      }
                    }
                  }
                  else {
                    pcVar9 = "talks about mining.";
                  }
                }
                else {
                  pcVar9 = "curses orcs.";
                }
              }
              break;
            }
            ptVar11 = t_at(level,(int)mtmp->mx,(int)mtmp->my);
            pcVar10 = "I\'m trapped!";
            if (ptVar11 != (trap *)0x0) {
              ptVar11->field_0x8 = ptVar11->field_0x8 | 0x20;
            }
          }
        }
        else {
          uVar5 = mt_random();
          if (0x55555555 < uVar5 * -0x55555555) {
            uVar5 = mt_random();
            bVar18 = (uVar5 & 1) == 0;
            pcVar9 = "Eh?";
            pcVar10 = "What?";
            goto LAB_002464fb;
          }
          pcVar10 = "Huh?";
        }
        goto switchD_00245b9e_default;
      }
      pcVar9 = "moans.";
    }
    else {
      pcVar9 = "wants nothing to do with you.";
    }
    break;
  case '\x15':
    if ((mtmp->field_0x62 & 0x40) == 0) {
      uVar5 = mt_random();
      pcVar10 = domonnoise_arrest_msg_rel +
                *(int *)(domonnoise_arrest_msg_rel + (ulong)(uVar5 % 3) * 4);
    }
    else {
      pcVar10 = "Ma\'am";
      if (flags.female == '\0') {
        pcVar10 = "Sir";
      }
      verbalize("Just the facts, %s.",pcVar10);
      pcVar10 = (char *)0x0;
    }
    goto switchD_00245b9e_default;
  case '\x16':
    ppcVar16 = domonnoise::soldier_pax_msg;
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      ppcVar16 = domonnoise::soldier_foe_msg;
    }
    uVar5 = mt_random();
    pcVar10 = ppcVar16[uVar5 % 3];
    goto switchD_00245b9e_default;
  case '\x17':
    lVar7 = money_cnt(invent);
    bVar18 = lVar7 == 0;
    pcVar9 = "Please follow me.";
    pcVar10 = "Please drop that gold and follow me.";
    goto LAB_002464fb;
  case '\x18':
    if (mtmp->mtame == '\0') {
      if ((mtmp->field_0x62 & 0x40) != 0) {
        pcVar10 = "I\'m free!";
        if (ppVar15 == mons + 300) {
          pcVar10 = (char *)0x0;
        }
        pcVar9 = "gurgles.";
        if (ppVar15 != mons + 300) {
          pcVar9 = (char *)0x0;
        }
        goto switchD_00245b9e_caseD_e;
      }
      pcVar10 = "This will teach you not to disturb me!";
    }
    else {
      pcVar10 = "Sorry, I\'m all out of wishes.";
    }
    goto switchD_00245b9e_default;
  case '\x19':
    if (uwep != (obj *)0x0) {
      pcVar10 = "Put that weapon away before you hurt someone!";
      if ((uwep->oclass == '\x02') ||
         ((uwep->oclass == '\x06' && (objects[uwep->otyp].oc_subtyp != '\0'))))
      goto switchD_00245b9e_default;
    }
    if ((uarmc == (obj *)0x0) &&
       (((uarm == (obj *)0x0 && (uarmh == (obj *)0x0)) &&
        ((uarms == (obj *)0x0 && ((uarmg == (obj *)0x0 && (uarmf == (obj *)0x0)))))))) {
      bVar18 = uarmu == (obj *)0x0;
      pcVar9 = "Relax, this won\'t hurt a bit.";
      pcVar10 = "Take off your shirt, please.";
    }
    else {
      bVar18 = urole.malenum == 0x15e;
      pcVar9 = "Doc, I can\'t help you unless you cooperate.";
      pcVar10 = "Please undress so I can examine you.";
    }
LAB_002464fb:
    if (bVar18) {
      pcVar10 = pcVar9;
    }
    goto switchD_00245b9e_default;
  case '\x1a':
    if (((ppVar15->mlet != '\x0e') && (flags.seduce_enabled != '\0')) &&
       (iVar3 = could_seduce(mtmp,&youmonst,(attack *)0x0), iVar3 == 1)) {
      doseduce(mtmp);
      goto LAB_0024640c;
    }
    uVar5 = poly_gender();
    uVar4 = 0;
    if (uVar5 != (*(uint *)&mtmp->field_0x60 & 1)) {
      uVar4 = mt_random();
      uVar4 = uVar4 % 3;
    }
    if (uVar4 == 2) {
      pcVar10 = "Hello, sailor.";
      goto switchD_00245b9e_default;
    }
    if (uVar4 == 1) {
      pcVar9 = "comes on to you.";
    }
    else {
      pcVar9 = "cajoles you.";
    }
    break;
  case '\x1b':
    iVar3 = night();
    bVar18 = (u.umonnum & 0xfffffffeU) == 0xe8;
    if (u.umonnum == u.umonster) {
      bVar18 = urace.malenum == 0xe8;
    }
    if (0x1a < (uint)u.umonnum || u.umonnum == u.umonster) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0x6400000 >> ((byte)u.umonnum & 0x1f);
    }
    pcVar10 = urace.individual.m;
    if (urace.individual.m == (char *)0x0) {
      pcVar10 = urace.noun;
    }
    pcVar9 = urace.individual.f;
    if (urace.individual.f == (char *)0x0) {
      pcVar9 = pcVar10;
    }
    if (flags.female == '\0') {
      pcVar9 = pcVar10;
    }
    cVar13 = (char)iVar3;
    if (mtmp->mtame != '\0') {
      if (bVar18) {
        pcVar10 = "evening";
        if (cVar13 == '\0') {
          pcVar10 = "day";
        }
        pcVar12 = "!";
        if (cVar13 == '\0') {
          pcVar12 = ".  Why do we not rest?";
        }
        pcVar9 = "Good %s to you Master%s";
      }
      else {
        pcVar10 = "";
        if ((uVar5 & 1) != 0) {
          pcVar10 = "Child of the night, ";
        }
        iVar3 = midnight();
        pcVar9 = "I beg you, help me satisfy this growing craving!";
        if (cVar13 == '\0') {
          pcVar9 = "I find myself growing a little weary.";
        }
        pcVar12 = "I can stand this craving no longer!";
        if (iVar3 == 0) {
          pcVar12 = pcVar9;
        }
        pcVar9 = "%s%s";
      }
      sprintf(local_138,pcVar9,pcVar10,pcVar12);
      pcVar10 = local_138;
      pcVar9 = (char *)0x0;
      goto switchD_00245b9e_caseD_e;
    }
    if ((mtmp->field_0x62 & 0x40) == 0) {
      if (!bVar18) {
        if (youmonst.data == mons + 0x8a || youmonst.data == mons + 0x94) {
          pcVar10 = "Young Fool";
          if (youmonst.data == mons + 0x94) {
            pcVar10 = "Fool";
          }
          pcVar9 = "%s! Your silver sheen does not frighten me!";
        }
        else {
          uVar5 = mt_random();
          if ((uVar5 & 1) == 0) {
            pcVar10 = body_part(0xf);
            pcVar9 = "I vant to suck your %s!";
          }
          else {
            if (u.umonnum != u.umonster) {
              pcVar9 = mons_mname(mons + u.umonnum);
            }
            pcVar10 = an(pcVar9);
            pcVar9 = "I vill come after %s without regret!";
          }
        }
LAB_0024685f:
        sprintf(local_138,pcVar9,pcVar10);
        pcVar10 = local_138;
        pcVar9 = (char *)0x0;
        goto switchD_00245b9e_caseD_e;
      }
      pcVar10 = "This is my hunting ground that you dare to prowl!";
    }
    else {
      if ((bool)(bVar18 & cVar13 != '\0')) {
        pcVar10 = "sister";
        if (flags.female == '\0') {
          pcVar10 = "brother";
        }
        pcVar9 = "Good feeding %s!";
        goto LAB_0024685f;
      }
      if (((byte)uVar5 & cVar13 != '\0') == 1) {
        acStack_116[0] = ' ';
        acStack_116[1] = 'n';
        acStack_116[2] = 'i';
        acStack_116[3] = 'g';
        acStack_116[4] = 'h';
        acStack_116[5] = 't';
        acStack_116[6] = '!';
        acStack_116[7] = '\0';
        uStack_118 = 0x6568;
        acStack_128[0] = ' ';
        acStack_128[1] = 'y';
        acStack_128[2] = 'o';
        acStack_128[3] = 'u';
        acStack_128[4] = ',';
        acStack_128[5] = ' ';
        acStack_128[6] = 'c';
        acStack_128[7] = 'h';
        uStack_120 = 0x6c69;
        local_11e = 0x7420666f2064;
        local_138[0] = 'H';
        local_138[1] = 'o';
        local_138[2] = 'w';
        local_138[3] = ' ';
        local_138[4] = 'n';
        local_138[5] = 'i';
        local_138[6] = 'c';
        local_138[7] = 'e';
        acStack_130[0] = ' ';
        acStack_130[1] = 't';
        acStack_130[2] = 'o';
        acStack_130[3] = ' ';
        acStack_130[4] = 'h';
        acStack_130[5] = 'e';
        acStack_130[6] = 'a';
        acStack_130[7] = 'r';
        pcVar10 = local_138;
      }
      else {
        pcVar10 = "I only drink... potions.";
      }
    }
    goto switchD_00245b9e_default;
  case '\x1c':
    iVar3 = monsndx(ppVar15);
    if (iVar3 != 0x10d) {
      if (((mtmp->field_0x62 & 0x40) == 0) || (mtmp->mtame != '\0')) goto switchD_00245b9e_caseD_1d;
      demon_talk(mtmp);
      goto LAB_0024640c;
    }
    pcVar10 = "Out of my way, scum!";
    if (((mtmp->field_0x62 & 0x40) == 0) && (mtmp->mtame == '\0')) {
      lVar7 = (long)u.ulevel;
      amount = lVar7 * 500;
      pcVar10 = Amonnam(mtmp);
      pcVar9 = currency(amount);
      pline("%s demands %ld %s to avoid re-arrest.",pcVar10,amount,pcVar9);
      lVar8 = bribe(mtmp);
      if (SBORROW8(lVar8,amount) == lVar8 + lVar7 * -500 < 0) {
        mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
        set_malign(mtmp);
        pcVar10 = "Good.  Now beat it, scum!";
      }
      else {
        verbalize("I said %ld!",amount);
        mtmp->mspec_used = 1000;
        pcVar10 = (char *)0x0;
      }
    }
    goto switchD_00245b9e_default;
  case '\x1d':
switchD_00245b9e_caseD_1d:
    if ((mtmp->field_0x62 & 0x40) == 0) {
      cuss(mtmp);
    }
    goto LAB_0024640c;
  case '\x1e':
    if (ppVar15 == mons + 0x144) {
      uVar5 = mt_random();
      bVar18 = (uVar5 * -0x33333333 >> 1 | (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f) <
               0x1999999a;
      pcVar10 = "WHO DO YOU THINK YOU ARE, WAR?";
      if (bVar18) {
        pcVar10 = (char *)0x0;
      }
      pcVar9 = "is busy reading a copy of Sandman #8.";
      if (!bVar18) {
        pcVar9 = (char *)0x0;
      }
      goto switchD_00245b9e_caseD_e;
    }
    pcVar10 = "Who do you think you are, War?";
    goto switchD_00245b9e_default;
  case '\x1f':
  case ' ':
  case '!':
    quest_chat(mtmp);
    goto LAB_0024640c;
  case '\"':
    shk_chat(mtmp);
    goto LAB_0024640c;
  case '#':
    iVar3 = doconsult(mtmp);
    return iVar3;
  case '$':
    priest_talk(mtmp);
LAB_0024640c:
    pcVar10 = (char *)0x0;
    goto switchD_00245b9e_default;
  case '%':
    pcVar9 = "seems to mutter a cantrip.";
    break;
  case '&':
    pcVar9 = "whispers inaudibly.  All you can make out is \"moon\".";
    if (flags.moonphase == 4) {
      uVar5 = night();
      uVar4 = mt_random();
      if (uVar5 != uVar4 * -0x3b13b13b < 0x13b13b14) {
        pcVar10 = Monnam(mtmp);
        iVar3 = pronoun_gender(level,mtmp);
        pcVar9 = "howl";
        if (ppVar15 == mons + 0x10e) {
          pcVar9 = "shriek";
        }
        pline("%s throws back %s head and lets out a blood curdling %s!",pcVar10,genders[iVar3].his,
              pcVar9);
        wake_nearto((int)mtmp->mx,(int)mtmp->my,0x79);
        pcVar10 = (char *)0x0;
        goto switchD_00245b9e_default;
      }
    }
    break;
  case '\'':
    if ((mtmp->field_0x62 & 0x40) != 0) goto switchD_00245b9e_caseD_14;
    uVar5 = mt_random();
    if ((uVar5 & 3) == 1) {
      pcVar9 = "complains about a diet of mutton.";
    }
    else {
      if ((uVar5 & 3) == 0) {
        pcVar10 = Monnam(mtmp);
        iVar3 = pronoun_gender(level,mtmp);
        pline("%s boasts about %s gem collection.",pcVar10,genders[iVar3].his);
        pcVar10 = (char *)0x0;
        goto switchD_00245b9e_default;
      }
      wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
      pcVar9 = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
    }
  }
  pcVar10 = (char *)0x0;
switchD_00245b9e_caseD_e:
  if (pcVar9 == (char *)0x0) {
    if (pcVar10 != (char *)0x0) {
      verbalize(pcVar10);
    }
  }
  else {
    pcVar10 = Monnam(mtmp);
    pline("%s %s",pcVar10,pcVar9);
  }
  return 1;
}

Assistant:

static int domonnoise(struct monst *mtmp)
{
    const char *pline_msg = 0,	/* Monnam(mtmp) will be prepended */
			*verbl_msg = 0;	/* verbalize() */
    const struct permonst *ptr = mtmp->data;
    char verbuf[BUFSZ];

    /* presumably nearness and sleep checks have already been made */
    if (!flags.soundok) return 0;
    if (is_silent(ptr)) return 0;

    /* Make sure its your role's quest quardian; adjust if not */
    if (ptr->msound == MS_GUARDIAN && ptr != &pm_guardian) {
	int mndx = monsndx(ptr);
	ptr = &mons[genus(mndx,1)];
    }

    /* be sure to do this before talking; the monster might teleport away, in
     * which case we want to check its pre-teleport position
     */
    if (!canspotmon(level, mtmp))
	map_invisible(mtmp->mx, mtmp->my);

    switch (ptr->msound) {
	case MS_ORACLE:
	    return doconsult(mtmp);
	case MS_PRIEST:
	    priest_talk(mtmp);
	    break;
	case MS_LEADER:
	case MS_NEMESIS:
	case MS_GUARDIAN:
	    quest_chat(mtmp);
	    break;
	case MS_SELL: /* pitch, pay, total */
	    shk_chat(mtmp);
	    break;
	case MS_VAMPIRE:
	    {
	    /* vampire messages are varied by tameness, peacefulness, and time of night */
		boolean isnight = night();
		boolean kindred = maybe_polyd(u.umonnum == PM_VAMPIRE ||
					      u.umonnum == PM_VAMPIRE_LORD,
					      Race_if(PM_VAMPIRE));
		boolean nightchild = (Upolyd && (u.umonnum == PM_WOLF ||
				       u.umonnum == PM_WINTER_WOLF ||
				       u.umonnum == PM_WINTER_WOLF_CUB));
		const char *racenoun = (flags.female && urace.individual.f) ?
					urace.individual.f : (urace.individual.m) ?
					urace.individual.m : urace.noun;

		if (mtmp->mtame) {
			if (kindred) {
				sprintf(verbuf, "Good %s to you Master%s",
					isnight ? "evening" : "day",
					isnight ? "!" : ".  Why do we not rest?");
				verbl_msg = verbuf;
		    	} else {
		    	    sprintf(verbuf,"%s%s",
				nightchild ? "Child of the night, " : "",
				midnight() ?
					"I can stand this craving no longer!" :
				isnight ?
					"I beg you, help me satisfy this growing craving!" :
					"I find myself growing a little weary.");
				verbl_msg = verbuf;
			}
		} else if (mtmp->mpeaceful) {
			if (kindred && isnight) {
				sprintf(verbuf, "Good feeding %s!",
	    				flags.female ? "sister" : "brother");
				verbl_msg = verbuf;
 			} else if (nightchild && isnight) {
				sprintf(verbuf,
				    "How nice to hear you, child of the night!");
				verbl_msg = verbuf;
	    		} else
		    		verbl_msg = "I only drink... potions.";
    	        } else {
			int vampindex;
	    		static const char * const vampmsg[] = {
			       /* These first two (0 and 1) are specially handled below */
	    			"I vant to suck your %s!",
	    			"I vill come after %s without regret!",
		    	       /* other famous vampire quotes can follow here if desired */
	    		};
			if (kindred)
			    verbl_msg = "This is my hunting ground that you dare to prowl!";
			else if (youmonst.data == &mons[PM_SILVER_DRAGON] ||
				 youmonst.data == &mons[PM_BABY_SILVER_DRAGON]) {
			    /* Silver dragons are silver in color, not made of silver */
			    sprintf(verbuf, "%s! Your silver sheen does not frighten me!",
					youmonst.data == &mons[PM_SILVER_DRAGON] ?
					"Fool" : "Young Fool");
			    verbl_msg = verbuf; 
			} else {
			    vampindex = rn2(SIZE(vampmsg));
			    if (vampindex == 0) {
				sprintf(verbuf, vampmsg[vampindex], body_part(BLOOD));
	    			verbl_msg = verbuf;
			    } else if (vampindex == 1) {
				sprintf(verbuf, vampmsg[vampindex],
					Upolyd ? an(mons_mname(&mons[u.umonnum])) : an(racenoun));
	    			verbl_msg = verbuf;
		    	    } else
			    	verbl_msg = vampmsg[vampindex];
			}
	        }
	    }
	    break;
	case MS_WERE:
	    if (flags.moonphase == FULL_MOON && (night() ^ !rn2(13))) {
		pline("%s throws back %s head and lets out a blood curdling %s!",
		      Monnam(mtmp), mhis(level, mtmp),
		      ptr == &mons[PM_HUMAN_WERERAT] ? "shriek" : "howl");
		wake_nearto(mtmp->mx, mtmp->my, 11*11);
	    } else
		pline_msg =
		     "whispers inaudibly.  All you can make out is \"moon\".";
	    break;
	case MS_BARK:
	    if (flags.moonphase == FULL_MOON && night()) {
		pline_msg = "howls.";
	    } else if (mtmp->mpeaceful) {
		if (mtmp->mtame &&
			(mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			 moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5))
		    pline_msg = "whines.";
		else if (mtmp->mtame && EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "yips.";
		else {
		    if (mtmp->data != &mons[PM_DINGO])	/* dingos do not actually bark */
			    pline_msg = "barks.";
		}
	    } else {
		pline_msg = "growls.";
	    }
	    break;
	case MS_MEW:
	    if (mtmp->mtame) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			mtmp->mtame < 5)
		    pline_msg = "yowls.";
		else if (moves > EDOG(mtmp)->hungrytime)
		    pline_msg = "meows.";
		else if (EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "purrs.";
		else
		    pline_msg = "mews.";
		break;
	    } /* else FALLTHRU */
	case MS_GROWL:
	    if (mtmp->mtame &&
		(mtmp->data == &mons[PM_MONKEY] ||
		 mtmp->data == &mons[PM_APE] ||
		 mtmp->data == &mons[PM_CARNIVOROUS_APE])) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
		    moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5) {
		    pline_msg = "shrieks.";
		    wake_nearto(mtmp->mx, mtmp->my, 8*8);
		} else if (EDOG(mtmp)->hungrytime > moves + 1000) {
		    pline_msg = "chatters.";
		} else {
		    pline_msg = "hoots.";
		}
	    } else {
		pline_msg = mtmp->mpeaceful ? "snarls." : "growls!";
	    }
	    break;
	case MS_ROAR:
	    pline_msg = mtmp->mpeaceful ? "snarls." : "roars!";
	    break;
	case MS_SQEEK:
	    pline_msg = "squeaks.";
	    break;
	case MS_SQAWK:
	    if (ptr == &mons[PM_RAVEN] && !mtmp->mpeaceful)
	    	verbl_msg = "Nevermore!";
	    else
	    	pline_msg = "squawks.";
	    break;
	case MS_HISS:
	    if (!mtmp->mpeaceful)
		pline_msg = "hisses!";
	    else return 0;	/* no sound */
	    break;
	case MS_BUZZ:
	    pline_msg = mtmp->mpeaceful ? "drones." : "buzzes angrily.";
	    break;
	case MS_GRUNT:
	    pline_msg = "grunts.";
	    break;
	case MS_NEIGH:
	    if (mtmp->mtame < 5)
		pline_msg = "neighs.";
	    else if (moves > EDOG(mtmp)->hungrytime)
		pline_msg = "whinnies.";
	    else
		pline_msg = "whickers.";
	    break;
	case MS_WAIL:
	    pline_msg = "wails mournfully.";
	    break;
	case MS_GURGLE:
	    pline_msg = "gurgles.";
	    break;
	case MS_BURBLE:
	    pline_msg = "burbles.";
	    break;
	case MS_SHRIEK:
	    pline_msg = "shrieks.";
	    aggravate();
	    break;
	case MS_IMITATE:
	    pline_msg = "imitates you.";
	    break;
	case MS_BONES:
	    pline("%s rattles noisily.", Monnam(mtmp));
	    pline("You freeze for a moment.");
	    nomul(-2, "scared by rattling");
	    break;
	case MS_LAUGH:
	    {
		static const char * const laugh_msg[4] = {
		    "giggles.", "chuckles.", "snickers.", "laughs.",
		};
		pline_msg = laugh_msg[rn2(4)];
	    }
	    break;
	case MS_MUMBLE:
	    pline_msg = "mumbles incomprehensibly.";
	    break;
	case MS_DJINNI:
	    if (mtmp->mtame) {
		verbl_msg = "Sorry, I'm all out of wishes.";
	    } else if (mtmp->mpeaceful) {
		if (ptr == &mons[PM_WATER_DEMON])
		    pline_msg = "gurgles.";
		else
		    verbl_msg = "I'm free!";
	    } else verbl_msg = "This will teach you not to disturb me!";
	    break;
	case MS_BOAST:	/* giants */
	    if (!mtmp->mpeaceful) {
		switch (rn2(4)) {
		case 0: pline("%s boasts about %s gem collection.",
			      Monnam(mtmp), mhis(level, mtmp));
			break;
		case 1: pline_msg = "complains about a diet of mutton.";
			break;
	       default: pline_msg = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
			wake_nearto(mtmp->mx, mtmp->my, 7*7);
			break;
		}
		break;
	    }
	    /* else FALLTHRU */
	case MS_HUMANOID:
	    if (!mtmp->mpeaceful) {
		if (In_endgame(&u.uz) && is_mplayer(ptr)) {
		    mplayer_talk(mtmp);
		    break;
		} else return 0;	/* no sound */
	    }
	    /* Generic peaceful humanoid behaviour. */
	    if (mtmp->mflee)
		pline_msg = "wants nothing to do with you.";
	    else if (mtmp->mhp < mtmp->mhpmax/4)
		pline_msg = "moans.";
	    else if (mtmp->mconf || mtmp->mstun)
		verbl_msg = !rn2(3) ? "Huh?" : rn2(2) ? "What?" : "Eh?";
	    else if (!mtmp->mcansee)
		verbl_msg = "I can't see!";
	    else if (mtmp->mtrapped) {
		struct trap *t = t_at(level, mtmp->mx, mtmp->my);

		if (t) t->tseen = 1;
		verbl_msg = "I'm trapped!";
	    } else if (mtmp->mhp < mtmp->mhpmax/2)
		pline_msg = "asks for a potion of healing.";
	    else if (mtmp->mtame && !mtmp->isminion &&
						moves > EDOG(mtmp)->hungrytime)
		verbl_msg = "I'm hungry.";
	    /* Specific monsters' interests */
	    else if (is_elf(ptr))
		pline_msg = "curses orcs.";
	    else if (is_dwarf(ptr))
		pline_msg = "talks about mining.";
	    else if (likes_magic(ptr))
		pline_msg = "talks about spellcraft.";
	    else if (ptr->mlet == S_CENTAUR)
		pline_msg = "discusses hunting.";
	    else switch (monsndx(ptr)) {
		case PM_HOBBIT:
		    pline_msg = (mtmp->mhpmax - mtmp->mhp >= 10) ?
				"complains about unpleasant dungeon conditions."
				: "asks you about the One Ring.";
		    break;
		case PM_ARCHEOLOGIST:
    pline_msg = "describes a recent article in \"Spelunker Today\" magazine.";
		    break;
		case PM_TOURIST:
		    verbl_msg = "Aloha.";
		    break;
		default:
		    pline_msg = "discusses dungeon exploration.";
		    break;
	    }
	    break;
	case MS_SEDUCE:
	    if (ptr->mlet != S_NYMPH && flags.seduce_enabled &&
		could_seduce(mtmp, &youmonst, NULL) == 1) {
			doseduce(mtmp);
			break;
	    }
	    
	    switch ((poly_gender() != (int) mtmp->female) ? rn2(3) : 0)
	    {
		case 2:
			verbl_msg = "Hello, sailor.";
			break;
		case 1:
			pline_msg = "comes on to you.";
			break;
		default:
			pline_msg = "cajoles you.";
	    }
	    break;
	case MS_ARREST:
	    if (mtmp->mpeaceful)
		verbalize("Just the facts, %s.",
		      flags.female ? "Ma'am" : "Sir");
	    else {
		static const char * const arrest_msg[3] = {
		    "Anything you say can be used against you.",
		    "You're under arrest!",
		    "Stop in the name of the Law!",
		};
		verbl_msg = arrest_msg[rn2(3)];
	    }
	    break;
	case MS_BRIBE:
	    if (monsndx(ptr) == PM_PRISON_GUARD) {
		long gdemand = 500 * u.ulevel;
		long goffer = 0;

		if (!mtmp->mpeaceful && !mtmp->mtame) {
		    pline("%s demands %ld %s to avoid re-arrest.",
			  Amonnam(mtmp), gdemand, currency(gdemand));
		    if ((goffer = bribe(mtmp)) >= gdemand) {
			verbl_msg = "Good.  Now beat it, scum!";
			mtmp->mpeaceful = 1;
			set_malign(mtmp);
		    } else {
			verbalize("I said %ld!", gdemand);
			mtmp->mspec_used = 1000;
		    }
		} else {
		    verbl_msg = "Out of my way, scum!"; /* still a jerk */
		}
		break;
	    } else if (mtmp->mpeaceful && !mtmp->mtame) {
		demon_talk(mtmp);
		break;
	    }
	    /* fall through */
	case MS_CUSS:
	    if (!mtmp->mpeaceful)
		cuss(mtmp);
	    break;
	case MS_SPELL:
	    /* deliberately vague, since it's not actually casting any spell */
	    pline_msg = "seems to mutter a cantrip.";
	    break;
	case MS_NURSE:
	    if (uwep && (uwep->oclass == WEAPON_CLASS || is_weptool(uwep)))
		verbl_msg = "Put that weapon away before you hurt someone!";
	    else if (uarmc || uarm || uarmh || uarms || uarmg || uarmf)
		verbl_msg = Role_if (PM_HEALER) ?
			  "Doc, I can't help you unless you cooperate." :
			  "Please undress so I can examine you.";
	    else if (uarmu)
		verbl_msg = "Take off your shirt, please.";
	    else
		verbl_msg = "Relax, this won't hurt a bit.";
	    break;
	case MS_GUARD:
	    if (money_cnt(invent))
		verbl_msg = "Please drop that gold and follow me.";
	    else
		verbl_msg = "Please follow me.";
	    break;
	case MS_SOLDIER:
	    {
		static const char * const soldier_foe_msg[3] = {
		    "Resistance is useless!",
		    "You're dog meat!",
		    "Surrender!",
		},		  * const soldier_pax_msg[3] = {
		    "What lousy pay we're getting here!",
		    "The food's not fit for Orcs!",
		    "My feet hurt, I've been on them all day!",
		};
		verbl_msg = mtmp->mpeaceful ? soldier_pax_msg[rn2(3)]
					    : soldier_foe_msg[rn2(3)];
	    }
	    break;
	case MS_RIDER:
	    if (ptr == &mons[PM_DEATH] && !rn2(10))
		pline_msg = "is busy reading a copy of Sandman #8.";
	    else
		verbl_msg = (ptr == &mons[PM_DEATH]) ?
			 "WHO DO YOU THINK YOU ARE, WAR?" :
			 "Who do you think you are, War?";
	    break;
    }

    if (pline_msg) pline("%s %s", Monnam(mtmp), pline_msg);
    else if (verbl_msg) verbalize(verbl_msg);
    return 1;
}